

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditSeedBuilderTests.cpp
# Opt level: O0

int __thiscall dit::anon_unknown_1::SeedBuilderTests::init(SeedBuilderTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  int extraout_EAX;
  SeedBuilderTest<bool> *pSVar2;
  SeedBuilderTest<signed_char> *pSVar3;
  SeedBuilderTest<short> *pSVar4;
  SeedBuilderTest<int> *pSVar5;
  SeedBuilderTest<unsigned_char> *pSVar6;
  SeedBuilderTest<unsigned_short> *pSVar7;
  SeedBuilderTest<unsigned_int> *pSVar8;
  SeedBuilderTest<float> *pSVar9;
  SeedBuilderTest<double> *pSVar10;
  SeedBuilderTest<tcu::Vector<int,_2>_> *pSVar11;
  SeedBuilderTest<tcu::Vector<int,_3>_> *pSVar12;
  SeedBuilderTest<tcu::Vector<int,_4>_> *pSVar13;
  TestNode *node;
  Vector<int,_4> local_f0;
  Vector<int,_4> local_e0;
  Vector<int,_4> local_d0;
  Vector<int,_3> local_c0;
  Vector<int,_2> local_b4;
  Vector<int,_4> local_ac;
  Vector<int,_3> local_9c;
  Vector<int,_2> local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  uint local_54 [3];
  unsigned_short local_46 [3];
  uchar local_3f [3];
  int local_3c [3];
  short local_2e [3];
  char local_28 [3];
  bool local_25 [20];
  bool local_11;
  SeedBuilderTests *local_10;
  SeedBuilderTests *this_local;
  
  local_10 = this;
  pSVar2 = (SeedBuilderTest<bool> *)operator_new(0x78);
  local_11 = true;
  SeedBuilderTest<bool>::SeedBuilderTest
            (pSVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,&local_11,0x7df80c3,
             "bool_true","Seed from boolean true.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (SeedBuilderTest<bool> *)operator_new(0x78);
  local_25[0] = false;
  SeedBuilderTest<bool>::SeedBuilderTest
            (pSVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,local_25,0x3041b39,
             "bool_false","Seed from boolean false.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar3 = (SeedBuilderTest<signed_char> *)operator_new(0x78);
  local_28[2] = 0;
  SeedBuilderTest<signed_char>::SeedBuilderTest
            (pSVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,local_28 + 2,0x3ba3062,
             "int8_zero","Seed from int8 zero.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  pSVar3 = (SeedBuilderTest<signed_char> *)operator_new(0x78);
  local_28[1] = 1;
  SeedBuilderTest<signed_char>::SeedBuilderTest
            (pSVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,local_28 + 1,0x59906f5,
             "int8_one","Seed from int8 one.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  pSVar3 = (SeedBuilderTest<signed_char> *)operator_new(0x78);
  local_28[0] = -1;
  SeedBuilderTest<signed_char>::SeedBuilderTest
            (pSVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,local_28,0x6dacb35,
             "int8_minus_one","Seed from int8 minus one.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  pSVar4 = (SeedBuilderTest<short> *)operator_new(0x78);
  local_2e[2] = 0;
  SeedBuilderTest<short>::SeedBuilderTest
            (pSVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,local_2e + 2,0x7ee822b,
             "int16_zero","Seed from int16 zero.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  pSVar4 = (SeedBuilderTest<short> *)operator_new(0x78);
  local_2e[1] = 1;
  SeedBuilderTest<short>::SeedBuilderTest
            (pSVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,local_2e + 1,0x36c2f4a,
             "int16_one","Seed from int16 one.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  pSVar4 = (SeedBuilderTest<short> *)operator_new(0x78);
  local_2e[0] = -1;
  SeedBuilderTest<short>::SeedBuilderTest
            (pSVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,local_2e,0x46f190b,
             "int16_minus_one","Seed from int16 minus one.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  pSVar5 = (SeedBuilderTest<int> *)operator_new(0x78);
  local_3c[2] = 0;
  SeedBuilderTest<int>::SeedBuilderTest
            (pSVar5,(this->super_TestCaseGroup).super_TestNode.m_testCtx,local_3c + 2,0x486ee55,
             "int32_zero","Seed from int32 zero.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar5);
  pSVar5 = (SeedBuilderTest<int> *)operator_new(0x78);
  local_3c[1] = 1;
  SeedBuilderTest<int>::SeedBuilderTest
            (pSVar5,(this->super_TestCaseGroup).super_TestNode.m_testCtx,local_3c + 1,0x5b57fd6,
             "int32_one","Seed from int32 one.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar5);
  pSVar5 = (SeedBuilderTest<int> *)operator_new(0x78);
  local_3c[0] = -1;
  SeedBuilderTest<int>::SeedBuilderTest
            (pSVar5,(this->super_TestCaseGroup).super_TestNode.m_testCtx,local_3c,0x468612b,
             "int32_minus_one","Seed from int32 minus one.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar5);
  pSVar6 = (SeedBuilderTest<unsigned_char> *)operator_new(0x78);
  local_3f[2] = 0;
  SeedBuilderTest<unsigned_char>::SeedBuilderTest
            (pSVar6,(this->super_TestCaseGroup).super_TestNode.m_testCtx,local_3f + 2,0x374982,
             "uint8_zero","Seed from uint8 zero.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar6);
  pSVar6 = (SeedBuilderTest<unsigned_char> *)operator_new(0x78);
  local_3f[1] = 1;
  SeedBuilderTest<unsigned_char>::SeedBuilderTest
            (pSVar6,(this->super_TestCaseGroup).super_TestNode.m_testCtx,local_3f + 1,0x6147f15,
             "uint8_one","Seed from uint8 one.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar6);
  pSVar6 = (SeedBuilderTest<unsigned_char> *)operator_new(0x78);
  local_3f[0] = 0xff;
  SeedBuilderTest<unsigned_char>::SeedBuilderTest
            (pSVar6,(this->super_TestCaseGroup).super_TestNode.m_testCtx,local_3f,0x557b2d5,
             "uint8_max","Seed from uint8 max.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar6);
  pSVar7 = (SeedBuilderTest<unsigned_short> *)operator_new(0x78);
  local_46[2] = 0;
  SeedBuilderTest<unsigned_short>::SeedBuilderTest
            (pSVar7,(this->super_TestCaseGroup).super_TestNode.m_testCtx,local_46 + 2,0x4ac7fac,
             "uint16_zero","Seed from uint16 zero.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar7);
  pSVar7 = (SeedBuilderTest<unsigned_short> *)operator_new(0x78);
  local_46[1] = 1;
  SeedBuilderTest<unsigned_short>::SeedBuilderTest
            (pSVar7,(this->super_TestCaseGroup).super_TestNode.m_testCtx,local_46 + 1,0x2ed2cd,
             "uint16_one","Seed from uint16 one.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar7);
  pSVar7 = (SeedBuilderTest<unsigned_short> *)operator_new(0x78);
  local_46[0] = 0xffff;
  SeedBuilderTest<unsigned_short>::SeedBuilderTest
            (pSVar7,(this->super_TestCaseGroup).super_TestNode.m_testCtx,local_46,0x72de48c,
             "uint16_max","Seed from uint16 max.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar7);
  pSVar8 = (SeedBuilderTest<unsigned_int> *)operator_new(0x78);
  local_54[2] = 0;
  SeedBuilderTest<unsigned_int>::SeedBuilderTest
            (pSVar8,(this->super_TestCaseGroup).super_TestNode.m_testCtx,local_54 + 2,0x271b3e9,
             "uint32_zero","Seed from uint32 zero.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar8);
  pSVar8 = (SeedBuilderTest<unsigned_int> *)operator_new(0x78);
  local_54[1] = 1;
  SeedBuilderTest<unsigned_int>::SeedBuilderTest
            (pSVar8,(this->super_TestCaseGroup).super_TestNode.m_testCtx,local_54 + 1,0x342226a,
             "uint32_one","Seed from uint32 one.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar8);
  pSVar8 = (SeedBuilderTest<unsigned_int> *)operator_new(0x78);
  local_54[0] = 0xffffffff;
  SeedBuilderTest<unsigned_int>::SeedBuilderTest
            (pSVar8,(this->super_TestCaseGroup).super_TestNode.m_testCtx,local_54,0x29f3c97,
             "uint32_max","Seed from uint32 max.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar8);
  pSVar9 = (SeedBuilderTest<float> *)operator_new(0x78);
  local_58 = 0.0;
  SeedBuilderTest<float>::SeedBuilderTest
            (pSVar9,(this->super_TestCaseGroup).super_TestNode.m_testCtx,&local_58,0x2742231,
             "float_zero","Seed from float zero.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar9);
  pSVar9 = (SeedBuilderTest<float> *)operator_new(0x78);
  local_5c = -0.0;
  SeedBuilderTest<float>::SeedBuilderTest
            (pSVar9,(this->super_TestCaseGroup).super_TestNode.m_testCtx,&local_5c,0x6b53f86,
             "float_negative_zero","Seed from float negative zero.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar9);
  pSVar9 = (SeedBuilderTest<float> *)operator_new(0x78);
  local_60 = 1.0;
  SeedBuilderTest<float>::SeedBuilderTest
            (pSVar9,(this->super_TestCaseGroup).super_TestNode.m_testCtx,&local_60,0x2a4d141,
             "float_one","Seed from float one.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar9);
  pSVar9 = (SeedBuilderTest<float> *)operator_new(0x78);
  local_64 = -1.0;
  SeedBuilderTest<float>::SeedBuilderTest
            (pSVar9,(this->super_TestCaseGroup).super_TestNode.m_testCtx,&local_64,0x665ccf6,
             "float_negative_one","Seed from float negative one.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar9);
  pSVar10 = (SeedBuilderTest<double> *)operator_new(0x80);
  local_70 = 0.0;
  SeedBuilderTest<double>::SeedBuilderTest
            (pSVar10,(this->super_TestCaseGroup).super_TestNode.m_testCtx,&local_70,0x7f499d9,
             "double_zero","Seed from double zero.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar10);
  pSVar10 = (SeedBuilderTest<double> *)operator_new(0x80);
  local_78 = -0.0;
  SeedBuilderTest<double>::SeedBuilderTest
            (pSVar10,(this->super_TestCaseGroup).super_TestNode.m_testCtx,&local_78,0x335846e,
             "double_negative_zero","Seed from double negative zero.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar10);
  pSVar10 = (SeedBuilderTest<double> *)operator_new(0x80);
  local_80 = 1.0;
  SeedBuilderTest<double>::SeedBuilderTest
            (pSVar10,(this->super_TestCaseGroup).super_TestNode.m_testCtx,&local_80,0x1030500,
             "double_one","Seed from double one.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar10);
  pSVar10 = (SeedBuilderTest<double> *)operator_new(0x80);
  local_88 = -1.0;
  SeedBuilderTest<double>::SeedBuilderTest
            (pSVar10,(this->super_TestCaseGroup).super_TestNode.m_testCtx,&local_88,0x5c218b7,
             "double_negative_one","Seed from double negative one.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar10);
  pSVar11 = (SeedBuilderTest<tcu::Vector<int,_2>_> *)operator_new(0x80);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  tcu::Vector<int,_2>::Vector(&local_90,0);
  SeedBuilderTest<tcu::Vector<int,_2>_>::SeedBuilderTest
            (pSVar11,pTVar1,&local_90,0x10f5ec,"ivec2_zero","Seed from zero vector.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar11);
  pSVar12 = (SeedBuilderTest<tcu::Vector<int,_3>_> *)operator_new(0x80);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  tcu::Vector<int,_3>::Vector(&local_9c,0);
  SeedBuilderTest<tcu::Vector<int,_3>_>::SeedBuilderTest
            (pSVar12,pTVar1,&local_9c,0x153ee48,"ivec3_zero","Seed from zero vector.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar12);
  pSVar13 = (SeedBuilderTest<tcu::Vector<int,_4>_> *)operator_new(0x88);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  tcu::Vector<int,_4>::Vector(&local_ac,0);
  SeedBuilderTest<tcu::Vector<int,_4>_>::SeedBuilderTest
            (pSVar13,pTVar1,&local_ac,0x468fc51,"ivec4_zero","Seed from zero vector.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar13);
  pSVar11 = (SeedBuilderTest<tcu::Vector<int,_2>_> *)operator_new(0x80);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  tcu::Vector<int,_2>::Vector(&local_b4,1);
  SeedBuilderTest<tcu::Vector<int,_2>_>::SeedBuilderTest
            (pSVar11,pTVar1,&local_b4,0xc39cfc,"ivec2_one","Seed from one vector.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar11);
  pSVar12 = (SeedBuilderTest<tcu::Vector<int,_3>_> *)operator_new(0x80);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  tcu::Vector<int,_3>::Vector(&local_c0,1);
  SeedBuilderTest<tcu::Vector<int,_3>_>::SeedBuilderTest
            (pSVar12,pTVar1,&local_c0,0x7fd657c,"ivec3_one","Seed from one vector.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar12);
  pSVar13 = (SeedBuilderTest<tcu::Vector<int,_4>_> *)operator_new(0x88);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  tcu::Vector<int,_4>::Vector(&local_d0,1);
  SeedBuilderTest<tcu::Vector<int,_4>_>::SeedBuilderTest
            (pSVar13,pTVar1,&local_d0,0x56698d6,"ivec4_one","Seed from one vector.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar13);
  pSVar13 = (SeedBuilderTest<tcu::Vector<int,_4>_> *)operator_new(0x88);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  tcu::Vector<int,_4>::Vector(&local_e0,1,2,3,4);
  SeedBuilderTest<tcu::Vector<int,_4>_>::SeedBuilderTest
            (pSVar13,pTVar1,&local_e0,0x5ea37c,"ivec4_1_2_3_4","Seed from (1, 2, 3, 4) vector.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar13);
  pSVar13 = (SeedBuilderTest<tcu::Vector<int,_4>_> *)operator_new(0x88);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  tcu::Vector<int,_4>::Vector(&local_f0,4,3,2,1);
  SeedBuilderTest<tcu::Vector<int,_4>_>::SeedBuilderTest
            (pSVar13,pTVar1,&local_f0,0x19b728a,"ivec4_4_3_2_1","Seed from (4, 3, 2, 1) vector.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar13);
  node = (TestNode *)operator_new(0x70);
  SeedBuilderMultipleValuesTest::SeedBuilderMultipleValuesTest
            ((SeedBuilderMultipleValuesTest *)node,
             (this->super_TestCaseGroup).super_TestNode.m_testCtx);
  tcu::TestNode::addChild((TestNode *)this,node);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		addChild(new SeedBuilderTest<bool>(m_testCtx, true,  132088003u, "bool_true", "Seed from boolean true."));
		addChild(new SeedBuilderTest<bool>(m_testCtx, false,  50600761u, "bool_false", "Seed from boolean false."));

		addChild(new SeedBuilderTest<deInt8>(m_testCtx,  0,  62533730u, "int8_zero", "Seed from int8 zero."));
		addChild(new SeedBuilderTest<deInt8>(m_testCtx,  1,  93914869u, "int8_one", "Seed from int8 one."));
		addChild(new SeedBuilderTest<deInt8>(m_testCtx, -1, 115002165u, "int8_minus_one", "Seed from int8 minus one."));

		addChild(new SeedBuilderTest<deInt16>(m_testCtx,  0, 133071403u, "int16_zero", "Seed from int16 zero."));
		addChild(new SeedBuilderTest<deInt16>(m_testCtx,  1,  57421642u, "int16_one", "Seed from int16 one."));
		addChild(new SeedBuilderTest<deInt16>(m_testCtx, -1,  74389771u, "int16_minus_one", "Seed from int16 minus one."));

		addChild(new SeedBuilderTest<deInt32>(m_testCtx,  0, 75951701u, "int32_zero", "Seed from int32 zero."));
		addChild(new SeedBuilderTest<deInt32>(m_testCtx,  1, 95780822u, "int32_one", "Seed from int32 one."));
		addChild(new SeedBuilderTest<deInt32>(m_testCtx, -1, 73949483u, "int32_minus_one", "Seed from int32 minus one."));

		addChild(new SeedBuilderTest<deUint8>(m_testCtx, 0,		  3623298u, "uint8_zero", "Seed from uint8 zero."));
		addChild(new SeedBuilderTest<deUint8>(m_testCtx, 1,		102006549u, "uint8_one", "Seed from uint8 one."));
		addChild(new SeedBuilderTest<deUint8>(m_testCtx, 255,	 89633493u, "uint8_max", "Seed from uint8 max."));

		addChild(new SeedBuilderTest<deUint16>(m_testCtx, 0,		 78413740u, "uint16_zero", "Seed from uint16 zero."));
		addChild(new SeedBuilderTest<deUint16>(m_testCtx, 1,		  3068621u, "uint16_one", "Seed from uint16 one."));
		addChild(new SeedBuilderTest<deUint16>(m_testCtx, 65535,	120448140u, "uint16_max", "Seed from uint16 max."));

		addChild(new SeedBuilderTest<deUint32>(m_testCtx, 0u,			41006057u, "uint32_zero", "Seed from uint32 zero."));
		addChild(new SeedBuilderTest<deUint32>(m_testCtx, 1u,			54665834u, "uint32_one", "Seed from uint32 one."));
		addChild(new SeedBuilderTest<deUint32>(m_testCtx, 4294967295u,	43990167u, "uint32_max", "Seed from uint32 max."));

		addChild(new SeedBuilderTest<float>(m_testCtx, 0.0f,	 41165361u, "float_zero", "Seed from float zero."));
		addChild(new SeedBuilderTest<float>(m_testCtx, -0.0f,	112541574u, "float_negative_zero", "Seed from float negative zero."));
		addChild(new SeedBuilderTest<float>(m_testCtx, 1.0f,	 44355905u, "float_one", "Seed from float one."));
		addChild(new SeedBuilderTest<float>(m_testCtx, -1.0f,	107334902u, "float_negative_one", "Seed from float negative one."));

		addChild(new SeedBuilderTest<double>(m_testCtx, 0.0,	133470681u, "double_zero", "Seed from double zero."));
		addChild(new SeedBuilderTest<double>(m_testCtx, -0.0,	 53838958u, "double_negative_zero", "Seed from double negative zero."));
		addChild(new SeedBuilderTest<double>(m_testCtx, 1.0,	 16975104u, "double_one", "Seed from double one."));
		addChild(new SeedBuilderTest<double>(m_testCtx, -1.0,	 96606391u, "double_negative_one", "Seed from double negative one."));

		addChild(new SeedBuilderTest<IVec2>(m_testCtx, IVec2(0),	 1111532u, "ivec2_zero", "Seed from zero vector."));
		addChild(new SeedBuilderTest<IVec3>(m_testCtx, IVec3(0),	22277704u, "ivec3_zero", "Seed from zero vector."));
		addChild(new SeedBuilderTest<IVec4>(m_testCtx, IVec4(0),	73989201u, "ivec4_zero", "Seed from zero vector."));

		addChild(new SeedBuilderTest<IVec2>(m_testCtx, IVec2(1),	 12819708u, "ivec2_one", "Seed from one vector."));
		addChild(new SeedBuilderTest<IVec3>(m_testCtx, IVec3(1),	134047100u, "ivec3_one", "Seed from one vector."));
		addChild(new SeedBuilderTest<IVec4>(m_testCtx, IVec4(1),	 90609878u, "ivec4_one", "Seed from one vector."));

		addChild(new SeedBuilderTest<IVec4>(m_testCtx, IVec4(1, 2, 3, 4),	 6202236u, "ivec4_1_2_3_4", "Seed from (1, 2, 3, 4) vector."));
		addChild(new SeedBuilderTest<IVec4>(m_testCtx, IVec4(4, 3, 2, 1),	26964618u, "ivec4_4_3_2_1", "Seed from (4, 3, 2, 1) vector."));

		addChild(new SeedBuilderMultipleValuesTest(m_testCtx));
	}